

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_var_to_local.cpp
# Opt level: O2

void __thiscall
optimization::global_var_to_local::Global_Var_to_Local::optimize_func
          (Global_Var_to_Local *this,MirFunction *func,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *global_vars)

{
  _Base_ptr p_Var1;
  int iVar2;
  variant_alternative_t<1UL,_variant<VarId,_basic_string<char>_>_> *pvVar3;
  size_type sVar4;
  _Base_ptr p_Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  key_type local_40;
  
  if (((global_vars->_M_t)._M_impl.super__Rb_tree_header._M_node_count != 0) &&
     ((func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    p_Var5 = (func->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = p_Var5[3]._M_left;
    for (p_Var5 = p_Var5[3]._M_parent; p_Var5 != p_Var1; p_Var5 = (_Base_ptr)&p_Var5->_M_parent) {
      iVar2 = (**(code **)(**(long **)p_Var5 + 8))();
      if ((iVar2 == 2) && (*(char *)(*(long *)p_Var5 + 0x38) == '\x01')) {
        pvVar3 = std::get<1ul,mir::inst::VarId,std::__cxx11::string>
                           ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)(*(long *)p_Var5 + 0x18));
        std::__cxx11::string::string((string *)&local_40,(string *)pvVar3);
        sVar4 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(global_vars,&local_40);
        if (sVar4 != 0) {
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&global_vars->_M_t,&local_40);
        }
        std::__cxx11::string::~string((string *)&local_40);
      }
    }
  }
  return;
}

Assistant:

void Global_Var_to_Local::optimize_func(mir::inst::MirFunction& func,
                                        std::set<std::string>& global_vars) {
  if (!global_vars.size() || !func.basic_blks.size()) {
    return;
  }
  auto& insts = func.basic_blks.begin()->second.inst;
  for (auto& inst : insts) {
    if (inst->inst_kind() == mir::inst::InstKind::Ref) {
      auto& i = *inst;
      auto ref = dynamic_cast<mir::inst::RefInst*>(&i);
      if (ref->val.index() == 1) {
        auto s = std::get<std::string>(ref->val);
        if (global_vars.count(s)) {
          global_vars.erase(s);
        }
      }
    }
  }
}